

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

int __thiscall
rw::Clump::clone(Clump *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint8 *puVar1;
  void **ppvVar2;
  LLLink *pLVar3;
  int iVar4;
  Clump *clump;
  Frame *pFVar5;
  undefined4 extraout_var;
  LLLink *pLVar6;
  void *extraout_RDX;
  void *__child_stack_00;
  void *extraout_RDX_00;
  LLLink *pLVar7;
  ObjectWithFrame *this_00;
  
  pLVar6 = (LLLink *)(ulong)(uint)__flags;
  clump = create();
  pFVar5 = Frame::cloneAndLink((Frame *)(this->object).parent);
  (clump->object).parent = pFVar5;
  pLVar7 = (this->atomics).link.next;
  if (pLVar7 != &(this->atomics).link) {
    __child_stack_00 = extraout_RDX;
    do {
      pLVar3 = pLVar7->next;
      iVar4 = Atomic::clone((Atomic *)&pLVar7[-6].prev,__fn,__child_stack_00,(int)pLVar6,__arg);
      this_00 = (ObjectWithFrame *)CONCAT44(extraout_var,iVar4);
      __fn = (__fn *)pLVar7[-5].next[0xc].next;
      ObjectWithFrame::setFrame(this_00,(Frame *)__fn);
      puVar1 = &(this_00->object).privateFlags;
      *puVar1 = *puVar1 | 1;
      *(Clump **)&this_00[2].object = clump;
      ppvVar2 = &this_00[2].object.parent;
      this_00[2].object.parent = &clump->atomics;
      this_00[2].inFrame.next = (clump->atomics).link.prev;
      pLVar6 = (clump->atomics).link.prev;
      pLVar6->next = (LLLink *)ppvVar2;
      (clump->atomics).link.prev = (LLLink *)ppvVar2;
      __child_stack_00 = extraout_RDX_00;
      pLVar7 = pLVar3;
    } while (pLVar3 != &(this->atomics).link);
  }
  Frame::purgeClone((Frame *)(this->object).parent);
  if (this->world != (World *)0x0) {
    World::addClump(this->world,clump);
  }
  PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)clump,(EVP_PKEY_CTX *)this);
  return (int)clump;
}

Assistant:

Clump*
Clump::clone(void)
{
	Clump *clump = Clump::create();
	Frame *root = this->getFrame()->cloneAndLink();
	clump->setFrame(root);
	FORLIST(lnk, this->atomics){
		Atomic *a = Atomic::fromClump(lnk);
		Atomic *atomic = a->clone();
		atomic->setFrame(a->getFrame()->root);
		clump->addAtomic(atomic);
	}
	this->getFrame()->purgeClone();

	// World extension
	if(this->world)
		this->world->addClump(clump);

	s_plglist.copy(clump, this);
	return clump;
}